

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP3Deserializer::ParseMetadata
          (BP3Deserializer *this,BufferSTL *bufferSTL,Engine *engine)

{
  char *pcVar1;
  long in_RDX;
  Engine *in_stack_00000020;
  BufferSTL *in_stack_00000028;
  BP3Deserializer *in_stack_00000030;
  string *in_stack_000000b0;
  BufferSTL *in_stack_000000b8;
  BP3Deserializer *in_stack_000000c0;
  Engine *in_stack_000000d0;
  BufferSTL *in_stack_000000d8;
  BP3Deserializer *in_stack_000000e0;
  BufferSTL *in_stack_00000268;
  BP3Deserializer *in_stack_00000270;
  allocator local_39;
  string local_38 [32];
  long local_18;
  
  local_18 = in_RDX;
  ParseMinifooter(in_stack_00000270,in_stack_00000268);
  pcVar1 = "Fortran";
  if (*(int *)(*(long *)(local_18 + 0x28) + 0x58) == 0) {
    pcVar1 = "C++";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  ParsePGIndex(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  ParseVariablesIndex(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  ParseAttributesIndex(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  return;
}

Assistant:

void BP3Deserializer::ParseMetadata(const BufferSTL &bufferSTL, core::Engine &engine)

{
    ParseMinifooter(bufferSTL);
    ParsePGIndex(bufferSTL,
                 (engine.m_IO.m_ArrayOrder == ArrayOrdering::RowMajor) ? "C++" : "Fortran");
    ParseVariablesIndex(bufferSTL, engine);
    ParseAttributesIndex(bufferSTL, engine);
}